

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::ReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ulong uVar1;
  int iVar2;
  Message *pMVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  Message *pMVar5;
  
  pMVar3 = UnsafeArenaReleaseMessage(this,message,field,factory);
  uVar1 = (message->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  pMVar5 = pMVar3;
  if ((pMVar3 != (Message *)0x0) && (puVar4 != (undefined8 *)0x0)) {
    iVar2 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3,0);
    pMVar5 = (Message *)CONCAT44(extraout_var,iVar2);
    (*(pMVar5->super_MessageLite)._vptr_MessageLite[0xd])(pMVar5,pMVar3);
  }
  return pMVar5;
}

Assistant:

Message* Reflection::ReleaseMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  CheckInvalidAccess(schema_, field);

  Message* released = UnsafeArenaReleaseMessage(message, field, factory);
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  released = MaybeForceCopy(message->GetArenaForAllocation(), released);
#endif  // PROTOBUF_FORCE_COPY_IN_RELEASE
  if (message->GetArenaForAllocation() != nullptr && released != nullptr) {
    Message* copy_from_arena = released->New();
    copy_from_arena->CopyFrom(*released);
    released = copy_from_arena;
  }
  return released;
}